

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawLoader.h
# Opt level: O1

void __thiscall Assimp::RAWImporter::MeshInformation::~MeshInformation(MeshInformation *this)

{
  pointer paVar1;
  pointer paVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  paVar1 = (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar1 != (pointer)0x0) {
    operator_delete(paVar1,(long)(this->colors).
                                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar1);
  }
  paVar2 = (this->vertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2,(long)(this->vertices).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar2);
  }
  pcVar3 = (this->name)._M_dataplus._M_p;
  paVar4 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

explicit MeshInformation(const std::string& _name)
            : name(_name)
        {
            vertices.reserve(100);
            colors.reserve(100);
        }